

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void drawGui_accessorsTab(void)

{
  cgltf_accessor *pcVar1;
  bool bVar2;
  cgltf_accessor *pcVar3;
  char *label;
  Span local_48 [16];
  Span<char> local_38;
  cgltf_accessor *local_28;
  cgltf_accessor *accessor;
  size_t i;
  CSpan<cgltf_accessor> accessors;
  
  tl::Span<const_cgltf_accessor>::Span
            ((Span<const_cgltf_accessor> *)&i,parsedData->accessors,parsedData->accessors_count);
  for (accessor = (cgltf_accessor *)0x0; pcVar1 = accessor,
      pcVar3 = (cgltf_accessor *)
               tl::Span<const_cgltf_accessor>::size((Span<const_cgltf_accessor> *)&i),
      pcVar1 < pcVar3; accessor = (cgltf_accessor *)((long)&accessor->component_type + 1)) {
    local_28 = tl::Span<const_cgltf_accessor>::operator[]
                         ((Span<const_cgltf_accessor> *)&i,(size_t)accessor);
    scratchStr();
    tl::toStringBuffer<unsigned_long>(&local_38,(unsigned_long *)&accessor);
    scratchStr();
    label = tl::Span::operator_cast_to_char_(local_48);
    bVar2 = ImGui::CollapsingHeader(label,0);
    if (bVar2) {
      ImGui::TreePush((void *)0x0);
      imguiAccessor(local_28);
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void drawGui_accessorsTab()
{
    CSpan<cgltf_accessor> accessors (parsedData->accessors, parsedData->accessors_count);
    for(size_t i = 0; i < accessors.size(); i++)
    {
        const cgltf_accessor& accessor = accessors[i];
        tl::toStringBuffer(scratchStr(), i);
        if(ImGui::CollapsingHeader(scratchStr()))
        {
            ImGui::TreePush();
            imguiAccessor(accessor);
            ImGui::TreePop();
        }
    }
}